

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O0

void pce_mml(int *ip)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  char local_a8 [7];
  char c;
  char mml [128];
  int local_18;
  int size;
  int bufsize;
  int offset;
  int *ip_local;
  
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  size = mml_start(buffer);
  local_18 = 0x2000 - size;
  while( true ) {
    iVar2 = getstring(ip,local_a8,0x7f);
    if (iVar2 == 0) {
      return;
    }
    iVar2 = mml_parse(buffer + size,local_18,local_a8);
    if (iVar2 == -1) break;
    size = iVar2 + size;
    local_18 = local_18 - iVar2;
    iVar2 = *ip;
    *ip = iVar2 + 1;
    cVar1 = prlnbuf[iVar2];
    if (((cVar1 != ',') && (cVar1 != ';')) && (cVar1 != '\0')) {
      error("Syntax error!");
      return;
    }
    if (cVar1 != ',') {
      iVar2 = mml_stop(buffer + size);
      putbuffer(buffer,iVar2 + size);
      if (pass != 1) {
        return;
      }
      println();
      return;
    }
    while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)prlnbuf[*ip]] & 0x2000) != 0) {
      *ip = *ip + 1;
    }
    if (prlnbuf[*ip] == '\\') {
      *ip = *ip + 1;
      while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)prlnbuf[*ip]] & 0x2000) != 0) {
        *ip = *ip + 1;
      }
      if ((prlnbuf[*ip] != ';') && (prlnbuf[*ip] != '\0')) {
        error("Syntax error!");
        return;
      }
      if (pass == 1) {
        println();
        clearln();
      }
      iVar2 = readline();
      if (iVar2 == -1) {
        return;
      }
      *ip = 0x1a;
    }
  }
  return;
}

Assistant:

void
pce_mml(int *ip)
{
	int offset, bufsize, size;
	char mml[128];
	char c;

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* start */
	bufsize = 8192;
	offset = mml_start(buffer);
	bufsize -= offset;

	/* extract and parse mml string(s) */
	for (;;) {
		/* get string */
		if (!getstring(ip, mml, 127))
			return;

		/* parse string */
		size = mml_parse(buffer + offset, bufsize, mml);

		if (size == -1)
			return;

		/* adjust buffer size */
		offset  += size;
		bufsize -= size;

		/* next string */
		c = prlnbuf[(*ip)++];

		if ((c != ',') && (c != ';') && (c != '\0')) {
			error("Syntax error!");
			return;
		}
		if (c != ',')
			break;

		/* skip spaces */
		while (isspace(prlnbuf[*ip]))
			(*ip)++;

		/* continuation char */
		if (prlnbuf[*ip] == '\\') {
			(*ip)++;

			/* skip spaces */
			while (isspace(prlnbuf[*ip]))
				(*ip)++;

			/* check */
			if (prlnbuf[*ip] == ';' || prlnbuf[*ip] == '\0') {
				/* output line */
				if (pass == LAST_PASS) {
					println();
					clearln();
				}

				/* read a new line */
				if (readline() == -1)
					return;
				
				/* rewind line pointer and continue */
				*ip = SFIELD;
			}
			else {
				error("Syntax error!");
				return;
			}
		}
	}			

	/* stop */
	offset += mml_stop(buffer + offset);

	/* store data */
	putbuffer(buffer, offset);

	/* output */
	if (pass == LAST_PASS)
		println();
}